

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O0

InputSource * __thiscall
xercesc_4_0::XercesDOMParser::resolveEntity
          (XercesDOMParser *this,XMLResourceIdentifier *resourceIdentifier)

{
  EntityResolver *pEVar1;
  int iVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  XMLResourceIdentifier *resourceIdentifier_local;
  XercesDOMParser *this_local;
  
  if (this->fEntityResolver == (EntityResolver *)0x0) {
    if (this->fXMLEntityResolver == (XMLEntityResolver *)0x0) {
      this_local = (XercesDOMParser *)0x0;
    }
    else {
      this_local = (XercesDOMParser *)
                   (**(code **)(*(long *)this->fXMLEntityResolver + 0x10))
                             (this->fXMLEntityResolver,resourceIdentifier);
    }
  }
  else {
    pEVar1 = this->fEntityResolver;
    pXVar3 = XMLResourceIdentifier::getPublicId(resourceIdentifier);
    pXVar4 = XMLResourceIdentifier::getSystemId(resourceIdentifier);
    iVar2 = (*pEVar1->_vptr_EntityResolver[2])(pEVar1,pXVar3,pXVar4);
    this_local = (XercesDOMParser *)CONCAT44(extraout_var,iVar2);
  }
  return (InputSource *)this_local;
}

Assistant:

InputSource*
XercesDOMParser::resolveEntity(XMLResourceIdentifier* resourceIdentifier)
{
    //
    //  Just map it to the SAX entity resolver. If there is not one installed,
    //  return a null pointer to cause the default resolution.
    //
    if (fEntityResolver)
        return fEntityResolver->resolveEntity(resourceIdentifier->getPublicId(),
                                                resourceIdentifier->getSystemId());
    if (fXMLEntityResolver)
        return fXMLEntityResolver->resolveEntity(resourceIdentifier);

    return 0;
}